

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

QTextStream * CPP::operator<<(QTextStream *str,iconFromThemeStringLiteral *i)

{
  QTextStream *pQVar1;
  _string<true> *in_RSI;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  QString local_30;
  _string<true> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QTextStream *)QTextStream::operator<<(in_RDI,"QIcon");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)language::qualifier);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,"fromTheme(");
  QString::QString((QString *)0x13d05c);
  language::_string<true>::_string(&local_18,(QString *)in_RSI,&local_30);
  pQVar1 = language::operator<<(pQVar1,in_RSI);
  QTextStream::operator<<(pQVar1,')');
  QString::~QString((QString *)0x13d09a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &operator<<(QTextStream &str, const iconFromThemeStringLiteral &i)
{
    str << "QIcon" << language::qualifier << "fromTheme(" << language::qstring(i.m_theme) << ')';
    return str;
}